

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_edge_cases.cpp
# Opt level: O1

bool test_uintwide_t_edge::test_import_bits(void)

{
  undefined2 uVar1;
  ushort uVar2;
  ushort uVar3;
  size_t __n;
  enable_if_t<std::is_integral<unsigned_int>::value,_bool> eVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  unsigned_long uVar8;
  undefined2 *puVar9;
  long lVar10;
  ulong uVar11;
  undefined2 *puVar12;
  uintwide_t<256U,_unsigned_short,_void,_false> *extraout_RDX;
  uintwide_t<256U,_unsigned_short,_void,_false> *extraout_RDX_00;
  uintwide_t<256U,_unsigned_short,_void,_false> *extraout_RDX_01;
  ulong __n_00;
  uintwide_t<256U,_unsigned_short,_void,_false> *extraout_RDX_02;
  uintwide_t<256U,_unsigned_short,_void,_false> *extraout_RDX_03;
  uintwide_t<256U,_unsigned_short,_void,_false> *extraout_RDX_04;
  uintwide_t<256U,_unsigned_short,_void,_false> *extraout_RDX_05;
  uintwide_t<256U,_unsigned_short,_void,_false> *extraout_RDX_06;
  uintwide_t<256U,_unsigned_short,_void,_false> *puVar13;
  byte bVar14;
  long lVar15;
  undefined8 *puVar16;
  uint i_1;
  bool bVar17;
  uint i;
  uint uVar18;
  uint uVar19;
  bool bVar20;
  local_boost_small_uint_type val_boost;
  string str_uintwide_t;
  string str_boost;
  local_double_width_input_array_type bits_double_width;
  local_representation_type bits;
  uintwide_t<256U,_unsigned_short,_void,_false> u_gen;
  string str_boost_2;
  false_ local_141;
  ulong local_140;
  data_type local_138;
  ulong local_118;
  string local_108;
  string local_e8;
  string local_c8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  unsigned_short local_88 [4];
  long local_80;
  long local_78;
  uintwide_t<256U,_unsigned_short,_void,_false> local_70;
  string local_50;
  
  uVar8 = util::util_pseudorandom_time_point_seed::value<unsigned_long>();
  uVar11 = 0x12dd397;
  if (uVar8 != 0) {
    uVar11 = uVar8 % 0x7fffffab + (ulong)(uVar8 % 0x7fffffab == 0);
  }
  lVar15 = 0;
  puVar16 = &eng_sgn;
  do {
    uVar11 = (uVar11 * 0x9c4e) % 0x7fffffab;
    *(ulong *)((long)&eng_sgn + lVar15) = (ulong)((uint)uVar11 & 0xffffff);
    lVar15 = lVar15 + 8;
  } while (lVar15 != 0xc0);
  _DAT_00212400 = (ulong)(DAT_002123f8 == 0);
  _DAT_00212408 = 0;
  uRam0000000000212410 = 0;
  uVar8 = util::util_pseudorandom_time_point_seed::value<unsigned_long>();
  std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>::seed
            ((subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL> *)eng_dig,uVar8);
  eng_dig._112_8_ = 0;
  uVar7 = 1;
  local_140 = 0;
  do {
    uVar18 = 0;
    do {
      generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
                (&local_70,(test_uintwide_t_edge *)0x1,false,0x4d,(int)puVar16);
      local_a8 = (pointer)CONCAT44(local_70.values.super_array<unsigned_short,_16UL>.elems._4_4_,
                                   local_70.values.super_array<unsigned_short,_16UL>.elems._0_4_);
      uStack_a0._0_2_ = local_70.values.super_array<unsigned_short,_16UL>.elems[4];
      uStack_a0._2_2_ = local_70.values.super_array<unsigned_short,_16UL>.elems[5];
      uStack_a0._4_2_ = local_70.values.super_array<unsigned_short,_16UL>.elems[6];
      uStack_a0._6_2_ = local_70.values.super_array<unsigned_short,_16UL>.elems[7];
      local_98._0_2_ = local_70.values.super_array<unsigned_short,_16UL>.elems[8];
      local_98._2_2_ = local_70.values.super_array<unsigned_short,_16UL>.elems[9];
      local_98._4_2_ = local_70.values.super_array<unsigned_short,_16UL>.elems[10];
      local_98._6_2_ = local_70.values.super_array<unsigned_short,_16UL>.elems[0xb];
      uStack_90._0_2_ = local_70.values.super_array<unsigned_short,_16UL>.elems[0xc];
      uStack_90._2_2_ = local_70.values.super_array<unsigned_short,_16UL>.elems[0xd];
      uStack_90._4_2_ = local_70.values.super_array<unsigned_short,_16UL>.elems[0xe];
      uStack_90._6_2_ = local_70.values.super_array<unsigned_short,_16UL>.elems[0xf];
      bVar17 = test_import_bits::msv_options._M_elems[local_140];
      if (bVar17 == true) {
        puVar12 = (undefined2 *)((long)&uStack_90 + 6);
        puVar9 = (undefined2 *)((long)&local_a8 + 2);
        do {
          uVar1 = puVar9[-1];
          puVar9[-1] = *puVar12;
          *puVar12 = uVar1;
          puVar12 = puVar12 + -1;
          bVar20 = puVar9 < puVar12;
          puVar9 = puVar9 + 1;
        } while (bVar20);
      }
      local_c8.field_2._M_allocated_capacity = 0;
      local_c8.field_2._8_8_ = 0;
      local_c8._M_dataplus._M_p = (pointer)0x0;
      local_c8._M_string_length = 0;
      local_138.m_data[2]._0_2_ = 0;
      local_138.m_data[2]._2_2_ = 0;
      local_138.m_data[2]._4_2_ = 0;
      local_138.m_data[2]._6_2_ = 0;
      local_138.m_data[3]._0_2_ = 0;
      local_138.m_data[3]._2_2_ = 0;
      local_138.m_data[3]._4_2_ = 0;
      local_138.m_data[3]._6_2_ = 0;
      local_138.m_data[0] = 0;
      local_138.m_data[1]._0_2_ = 0;
      local_138.m_data[1]._2_2_ = 0;
      local_138.m_data[1]._4_2_ = 0;
      local_138.m_data[1]._6_2_ = 0;
      local_118 = 1;
      uVar19 = (~uVar18 & 1) << 4;
      puVar16 = (undefined8 *)(ulong)bVar17;
      math::wide_integer::import_bits<const_unsigned_short_*,_256U,_unsigned_short,_void,_nullptr>
                ((uintwide_t<256U,_unsigned_short,_void,_false> *)&local_c8,
                 (unsigned_short *)&local_a8,local_88,uVar19,bVar17);
      if (bVar17 == false) {
        local_118 = 4;
        local_138.m_data[2]._0_2_ = (value_type_conflict3)local_98;
        local_138.m_data[2]._2_2_ = local_98._2_2_;
        local_138.m_data[2]._4_2_ = local_98._4_2_;
        local_138.m_data[2]._6_2_ = local_98._6_2_;
        local_138.m_data[3]._0_2_ = (value_type_conflict3)uStack_90;
        local_138.m_data[3]._2_2_ = uStack_90._2_2_;
        local_138.m_data[3]._4_2_ = uStack_90._4_2_;
        local_138.m_data[3]._6_2_ = uStack_90._6_2_;
        local_138.m_data[0] = (limb_type)local_a8;
        local_138.m_data[1]._0_2_ = (value_type_conflict3)uStack_a0;
        local_138.m_data[1]._2_2_ = uStack_a0._2_2_;
        local_138.m_data[1]._4_2_ = uStack_a0._4_2_;
        local_138.m_data[1]._6_2_ = uStack_a0._6_2_;
        uVar11 = 3;
        do {
          puVar13 = extraout_RDX;
          if (*(long *)((long)&local_138 + uVar11 * 8) != 0) break;
          local_118 = uVar11;
          uVar11 = uVar11 - 1;
        } while (uVar11 != 0);
      }
      else {
        puVar16 = (undefined8 *)0x1;
        boost::multiprecision::detail::
        import_bits_generic<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,(boost::multiprecision::expression_template_option)0,unsigned_short_const*>
                  ((number<boost::multiprecision::backends::cpp_int_backend<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_138,(unsigned_short *)&local_a8,local_88,uVar19,true);
        puVar13 = extraout_RDX_00;
      }
      math::wide_integer::to_string<256u,unsigned_short,void,false>
                (&local_108,(wide_integer *)&local_c8,puVar13);
      boost::multiprecision::backends::
      cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>
      ::do_get_string_abi_cxx11_
                (&local_e8,
                 (cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>
                  *)&local_138,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max),(false_ *)&local_50);
      if ((local_108._M_string_length ==
           CONCAT44(local_e8._M_string_length._4_4_,(undefined4)local_e8._M_string_length)) &&
         ((local_108._M_string_length == 0 ||
          (iVar5 = bcmp(local_108._M_dataplus._M_p,local_e8._M_dataplus._M_p,
                        local_108._M_string_length), iVar5 == 0)))) {
        lVar15 = 0x1e;
        do {
          bVar14 = 0;
          if (lVar15 == -2) break;
          uVar2 = *(ushort *)
                   ((long)local_70.values.super_array<unsigned_short,_16UL>.elems + lVar15);
          uVar3 = *(ushort *)((long)&local_c8._M_dataplus._M_p + lVar15);
          bVar14 = -(uVar2 <= uVar3) | 1;
          lVar15 = lVar15 + -2;
        } while (uVar2 == uVar3);
        if (bVar14 != 0) {
          uVar7 = 0;
        }
      }
      else {
        uVar7 = 0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,
                        CONCAT44(local_e8.field_2._M_allocated_capacity._4_4_,
                                 local_e8.field_2._M_allocated_capacity._0_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != 0x40);
    local_140 = local_140 + 1;
  } while (local_140 != 2);
  local_140 = (ulong)uVar7;
  local_80 = 0;
  do {
    local_78 = 0;
    do {
      iVar5 = 0;
      do {
        generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
                  (&local_70,(test_uintwide_t_edge *)0x1,false,0x4d,(int)puVar16);
        bVar17 = test_import_bits::msv_options._M_elems[local_80];
        if (bVar17 == true) {
          puVar12 = (undefined2 *)((long)&uStack_90 + 6);
          puVar9 = (undefined2 *)((long)&local_a8 + 2);
          do {
            uVar1 = puVar9[-1];
            puVar9[-1] = *puVar12;
            *puVar12 = uVar1;
            puVar12 = puVar12 + -1;
            bVar20 = puVar9 < puVar12;
            puVar9 = puVar9 + 1;
          } while (bVar20);
        }
        local_c8.field_2._M_allocated_capacity = 0;
        local_c8.field_2._8_8_ = 0;
        local_c8._M_dataplus._M_p = (pointer)0x0;
        local_c8._M_string_length = 0;
        local_138.m_data[2]._0_2_ = 0;
        local_138.m_data[2]._2_2_ = 0;
        local_138.m_data[2]._4_2_ = 0;
        local_138.m_data[2]._6_2_ = 0;
        local_138.m_data[3]._0_2_ = 0;
        local_138.m_data[3]._2_2_ = 0;
        local_138.m_data[3]._4_2_ = 0;
        local_138.m_data[3]._6_2_ = 0;
        local_138.m_data[0] = 0;
        local_138.m_data[1]._0_2_ = 0;
        local_138.m_data[1]._2_2_ = 0;
        local_138.m_data[1]._4_2_ = 0;
        local_138.m_data[1]._6_2_ = 0;
        local_118 = 1;
        uVar7 = *(uint *)((long)test_import_bits::bits_for_chunks._M_elems + local_78);
        puVar16 = (undefined8 *)(ulong)(uint)bVar17;
        math::wide_integer::import_bits<const_unsigned_short_*,_256U,_unsigned_short,_void,_nullptr>
                  ((uintwide_t<256U,_unsigned_short,_void,_false> *)&local_c8,
                   (unsigned_short *)&local_a8,local_88,uVar7,bVar17);
        if ((uVar7 & 7) == 0 && bVar17 == false) {
          uVar11 = (ulong)(uVar7 >> 3);
          if (uVar7 == 0) {
            uVar11 = 2;
          }
          uVar7 = (int)uVar11 * 2;
          local_118 = (ulong)uVar7;
          if (3 < uVar7) {
            local_118 = 4;
          }
          *(undefined8 *)((long)&local_138 + (ulong)((int)local_118 - 1) * 8) = 0;
          __n_00 = (local_118 & 0xffffffff) << 3;
          if (uVar11 << 4 <= __n_00) {
            __n_00 = uVar11 << 4;
          }
          memcpy(&local_138,&local_a8,__n_00);
          while ((uVar11 = local_118 - 1, puVar13 = extraout_RDX_02, uVar11 != 0 &&
                 (*(long *)((long)&local_138 + uVar11 * 8) == 0))) {
            local_118 = uVar11;
          }
        }
        else {
          puVar16 = (undefined8 *)(ulong)(uint)bVar17;
          boost::multiprecision::detail::
          import_bits_generic<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,(boost::multiprecision::expression_template_option)0,unsigned_short_const*>
                    ((number<boost::multiprecision::backends::cpp_int_backend<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_138,(unsigned_short *)&local_a8,local_88,uVar7,bVar17);
          puVar13 = extraout_RDX_01;
        }
        math::wide_integer::to_string<256u,unsigned_short,void,false>
                  (&local_108,(wide_integer *)&local_c8,puVar13);
        boost::multiprecision::backends::
        cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>
        ::do_get_string_abi_cxx11_
                  (&local_e8,
                   (cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>
                    *)&local_138,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max),(false_ *)&local_50);
        if (local_108._M_string_length ==
            CONCAT44(local_e8._M_string_length._4_4_,(undefined4)local_e8._M_string_length)) {
          if (local_108._M_string_length != 0) {
            iVar6 = bcmp(local_108._M_dataplus._M_p,local_e8._M_dataplus._M_p,
                         local_108._M_string_length);
            uVar7 = (uint)local_140 & 0xff;
            if (iVar6 != 0) {
              uVar7 = 0;
            }
            local_140 = CONCAT44(local_140._4_4_,uVar7);
          }
        }
        else {
          local_140 = local_140 & 0xffffffff00000000;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,
                          CONCAT44(local_e8.field_2._M_allocated_capacity._4_4_,
                                   local_e8.field_2._M_allocated_capacity._0_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        iVar5 = iVar5 + 1;
      } while (iVar5 != 0x40);
      local_78 = local_78 + 4;
    } while (local_78 != 0xc);
    local_80 = local_80 + 1;
  } while (local_80 != 2);
  lVar15 = 0;
  local_78 = 0xc;
  local_80 = 2;
  do {
    iVar5 = 0;
    do {
      generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
                (&local_70,(test_uintwide_t_edge *)0x1,false,0x4d,(int)puVar16);
      local_a8 = (pointer)CONCAT44(local_70.values.super_array<unsigned_short,_16UL>.elems._4_4_,
                                   local_70.values.super_array<unsigned_short,_16UL>.elems._0_4_);
      uStack_a0 = CONCAT44(local_70.values.super_array<unsigned_short,_16UL>.elems._12_4_,
                           local_70.values.super_array<unsigned_short,_16UL>.elems._8_4_);
      local_98 = CONCAT44(local_70.values.super_array<unsigned_short,_16UL>.elems._20_4_,
                          local_70.values.super_array<unsigned_short,_16UL>.elems._16_4_);
      uStack_90 = CONCAT44(local_70.values.super_array<unsigned_short,_16UL>.elems._28_4_,
                           local_70.values.super_array<unsigned_short,_16UL>.elems._24_4_);
      lVar10 = 0;
      do {
        *(undefined4 *)((long)&local_c8._M_dataplus._M_p + lVar10) =
             *(undefined4 *)((long)&local_a8 + lVar10);
        lVar10 = lVar10 + 4;
      } while (lVar10 != 0x20);
      local_108.field_2._M_allocated_capacity = 0;
      local_108.field_2._8_8_ = 0;
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      local_138.m_data[2]._0_2_ = 0;
      local_138.m_data[2]._2_2_ = 0;
      local_138.m_data[2]._4_2_ = 0;
      local_138.m_data[2]._6_2_ = 0;
      local_138.m_data[3]._0_2_ = 0;
      local_138.m_data[3]._2_2_ = 0;
      local_138.m_data[3]._4_2_ = 0;
      local_138.m_data[3]._6_2_ = 0;
      local_138.m_data[0] = 0;
      local_138.m_data[1]._0_2_ = 0;
      local_138.m_data[1]._2_2_ = 0;
      local_138.m_data[1]._4_2_ = 0;
      local_138.m_data[1]._6_2_ = 0;
      local_118 = 1;
      bVar17 = test_import_bits::msv_options._M_elems[lVar15];
      puVar16 = (undefined8 *)(ulong)(uint)bVar17;
      math::wide_integer::import_bits<const_unsigned_int_*,_256U,_unsigned_short,_void,_nullptr>
                ((uintwide_t<256U,_unsigned_short,_void,_false> *)&local_108,(uint *)&local_c8,
                 (uint *)&local_a8,0x20,bVar17);
      if (bVar17 == 0) {
        local_118 = 4;
        local_138.m_data[2]._0_4_ = (undefined4)local_c8.field_2._M_allocated_capacity;
        local_138.m_data[2]._4_4_ = (undefined4)((ulong)local_c8.field_2._0_8_ >> 0x20);
        local_138.m_data[3]._0_4_ = (undefined4)local_c8.field_2._8_8_;
        local_138.m_data[3]._4_4_ = (undefined4)((ulong)local_c8.field_2._8_8_ >> 0x20);
        local_138.m_data[0] = (limb_type)local_c8._M_dataplus._M_p;
        local_138.m_data[1]._0_4_ = (undefined4)local_c8._M_string_length;
        local_138.m_data[1]._4_4_ = (undefined4)(local_c8._M_string_length >> 0x20);
        uVar11 = 3;
        do {
          puVar13 = extraout_RDX_03;
          if (*(long *)((long)&local_138 + uVar11 * 8) != 0) break;
          local_118 = uVar11;
          uVar11 = uVar11 - 1;
        } while (uVar11 != 0);
      }
      else {
        puVar16 = (undefined8 *)0x1;
        boost::multiprecision::detail::
        import_bits_generic<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,(boost::multiprecision::expression_template_option)0,unsigned_int_const*>
                  ((number<boost::multiprecision::backends::cpp_int_backend<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_138,(uint *)&local_c8,(uint *)&local_a8,0x20,true);
        puVar13 = extraout_RDX_04;
      }
      math::wide_integer::to_string<256u,unsigned_short,void,false>
                (&local_e8,(wide_integer *)&local_108,puVar13);
      boost::multiprecision::backends::
      cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>
      ::do_get_string_abi_cxx11_
                (&local_50,
                 (cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>
                  *)&local_138,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max),&local_141);
      __n = CONCAT44(local_e8._M_string_length._4_4_,(undefined4)local_e8._M_string_length);
      if (__n == CONCAT44(local_50._M_string_length._4_4_,(undefined4)local_50._M_string_length)) {
        if (__n != 0) {
          iVar6 = bcmp(local_e8._M_dataplus._M_p,local_50._M_dataplus._M_p,__n);
          uVar7 = (uint)local_140 & 0xff;
          if (iVar6 != 0) {
            uVar7 = 0;
          }
          local_140 = CONCAT44(local_140._4_4_,uVar7);
        }
      }
      else {
        local_140 = local_140 & 0xffffffff00000000;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT44(local_50.field_2._M_allocated_capacity._4_4_,
                                 local_50.field_2._M_allocated_capacity._0_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,
                        CONCAT44(local_e8.field_2._M_allocated_capacity._4_4_,
                                 local_e8.field_2._M_allocated_capacity._0_4_) + 1);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 != 0x40);
    lVar15 = lVar15 + 1;
  } while (lVar15 != 2);
  lVar15 = 0;
  do {
    iVar5 = 0;
    do {
      generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
                (&local_70,(test_uintwide_t_edge *)0x1,false,0x4d,(int)puVar16);
      lVar10 = 0;
      do {
        *(undefined4 *)((long)&local_50._M_dataplus._M_p + lVar10) =
             *(undefined4 *)((long)&local_e8._M_dataplus._M_p + lVar10);
        lVar10 = lVar10 + 4;
      } while (lVar10 != 0x1c);
      local_98 = 0;
      uStack_90 = 0;
      local_a8 = (pointer)0x0;
      uStack_a0 = 0;
      local_138.m_data[2]._0_2_ = 0;
      local_138.m_data[2]._2_2_ = 0;
      local_138.m_data[2]._4_2_ = 0;
      local_138.m_data[2]._6_2_ = 0;
      local_138.m_data[3]._0_2_ = 0;
      local_138.m_data[3]._2_2_ = 0;
      local_138.m_data[3]._4_2_ = 0;
      local_138.m_data[3]._6_2_ = 0;
      local_138.m_data[0] = 0;
      local_138.m_data[1]._0_2_ = 0;
      local_138.m_data[1]._2_2_ = 0;
      local_138.m_data[1]._4_2_ = 0;
      local_138.m_data[1]._6_2_ = 0;
      local_118 = 1;
      bVar17 = test_import_bits::msv_options._M_elems[lVar15];
      puVar16 = (undefined8 *)(ulong)(uint)bVar17;
      math::wide_integer::import_bits<const_unsigned_int_*,_256U,_unsigned_short,_void,_nullptr>
                ((uintwide_t<256U,_unsigned_short,_void,_false> *)&local_a8,(uint *)&local_50,
                 (uint *)(local_50.field_2._M_local_buf + 0xc),0x20,bVar17);
      if (bVar17 == 0) {
        local_118 = 4;
        local_138.m_data[3]._4_2_ = 0;
        local_138.m_data[3]._6_2_ = 0;
        local_138.m_data[2]._0_4_ = local_50.field_2._M_allocated_capacity._0_4_;
        local_138.m_data[2]._4_4_ = local_50.field_2._M_allocated_capacity._4_4_;
        local_138.m_data[3]._0_4_ = local_50.field_2._8_4_;
        local_138.m_data[0] = (limb_type)local_50._M_dataplus._M_p;
        local_138.m_data[1]._0_2_ = (value_type_conflict3)local_50._M_string_length;
        local_138.m_data[1]._2_2_ = local_50._M_string_length._2_2_;
        local_138.m_data[1]._4_2_ = local_50._M_string_length._4_2_;
        local_138.m_data[1]._6_2_ = local_50._M_string_length._6_2_;
        uVar11 = 3;
        do {
          puVar13 = extraout_RDX_05;
          if (*(long *)((long)&local_138 + uVar11 * 8) != 0) break;
          local_118 = uVar11;
          uVar11 = uVar11 - 1;
        } while (uVar11 != 0);
      }
      else {
        puVar16 = (undefined8 *)0x1;
        boost::multiprecision::detail::
        import_bits_generic<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,(boost::multiprecision::expression_template_option)0,unsigned_int_const*>
                  ((number<boost::multiprecision::backends::cpp_int_backend<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_138,(uint *)&local_50,(uint *)(local_50.field_2._M_local_buf + 0xc),
                   0x20,true);
        puVar13 = extraout_RDX_06;
      }
      math::wide_integer::to_string<256u,unsigned_short,void,false>
                (&local_c8,(wide_integer *)&local_a8,puVar13);
      boost::multiprecision::backends::
      cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>
      ::do_get_string_abi_cxx11_
                (&local_108,
                 (cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>
                  *)&local_138,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max),&local_141);
      if (local_c8._M_string_length == local_108._M_string_length) {
        if (local_c8._M_string_length != 0) {
          iVar6 = bcmp(local_c8._M_dataplus._M_p,local_108._M_dataplus._M_p,
                       local_c8._M_string_length);
          uVar7 = (uint)local_140 & 0xff;
          if (iVar6 != 0) {
            uVar7 = 0;
          }
          local_140 = CONCAT44(local_140._4_4_,uVar7);
        }
      }
      else {
        local_140 = local_140 & 0xffffffff00000000;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 != 0x40);
    lVar15 = lVar15 + 1;
    if (lVar15 == 2) {
      local_70.values.super_array<unsigned_short,_16UL>.elems[0] = 0xaaaa;
      local_70.values.super_array<unsigned_short,_16UL>.elems[1] = 0x5555;
      lVar15 = 0;
      uVar7 = (uint)local_140;
      do {
        local_138.m_data[2]._0_4_ = 0;
        local_138.m_data[2]._4_4_ = 0;
        local_138.m_data[3]._0_4_ = 0;
        local_138.m_data[3]._4_4_ = 0;
        uVar18 = *(uint *)((long)test_import_bits::various_chunk_sizes._M_elems + lVar15);
        uVar19 = 0x20;
        if (uVar18 < 0x20) {
          uVar19 = uVar18;
        }
        local_138.m_data[0] = 0;
        local_138.m_data[1]._0_4_ = 0;
        local_138.m_data[1]._4_4_ = 0;
        if (uVar18 == 0) {
          uVar19 = 0x20;
        }
        math::wide_integer::detail::
        import_export_helper<unsigned_int_const*,math::wide_integer::detail::iterator_detail::reverse_iterator<unsigned_short*>>
                  ((uint *)&local_70,
                   (unsigned_short *)
                   ((long)&local_138 + (ulong)((uVar19 & 0xf) != 0) * 2 + (ulong)(uVar19 >> 3 & 6)),
                   (ulong)uVar19,(ulong)uVar19,0x10);
        eVar4 = math::wide_integer::operator==
                          ((uintwide_t<256U,_unsigned_short,_void,_false> *)&local_138,
                           (uint *)((long)test_import_bits::various_import_results._M_elems + lVar15
                                   ));
        bVar17 = (bool)((byte)uVar7 & eVar4);
        uVar7 = (uint)bVar17;
        lVar15 = lVar15 + 4;
      } while (lVar15 != 0x10);
      return bVar17;
    }
  } while( true );
}

Assistant:

auto test_import_bits() -> bool // NOLINT(readability-function-cognitive-complexity)
{
  eng_sgn.seed(util::util_pseudorandom_time_point_seed::value<typename eng_sgn_type::result_type>());
  eng_dig.seed(util::util_pseudorandom_time_point_seed::value<typename eng_dig_type::result_type>());

  using local_boost_small_uint_backend_type =
    boost::multiprecision::cpp_int_backend<local_edge_cases::local_digits2_small,
                                           local_edge_cases::local_digits2_small,
                                           boost::multiprecision::unsigned_magnitude,
                                           boost::multiprecision::unchecked,
                                           void>;

  using local_boost_small_uint_type =
    boost::multiprecision::number<local_boost_small_uint_backend_type,
                                  boost::multiprecision::et_off>;

  auto result_is_ok = true;

  static const std::array<bool, static_cast<std::size_t>(UINT8_C(2))> msv_options = { true, false };

  for(const auto& msv_first : msv_options) // NOLINT
  {
    for(auto   i = static_cast<unsigned>(UINT8_C(0));
               i < static_cast<unsigned>(loop_count_lo);
             ++i)
    {
      // Verify import_bits() and compare with Boost control value(s).
      // The input and output ranges have elements having the same widths.
      // Use the full bit width and representation length of uintwide_t.

      using local_representation_type = typename local_uintwide_t_small_unsigned_type::representation_type;
      using local_input_value_type    = typename local_representation_type::value_type;

      auto u_gen = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();

      local_representation_type bits(u_gen.crepresentation());

      if(msv_first)
      {
        std::reverse(bits.begin(), bits.end());
      }

      local_uintwide_t_small_unsigned_type val_uintwide_t { };
      local_boost_small_uint_type          val_boost      { };

      const auto oscillated_chunk_size =
        static_cast<unsigned>
        (
          static_cast<unsigned>(i % 2U) == 0U
            ? static_cast<unsigned>(std::numeric_limits<local_input_value_type>::digits)
            : 0U
        );

      static_cast<void>(import_bits(val_uintwide_t, bits.cbegin(), bits.cend(), oscillated_chunk_size, msv_first));
      static_cast<void>(import_bits(val_boost,      bits.cbegin(), bits.cend(), oscillated_chunk_size, msv_first)); // NOLINT

      using std::to_string;

      const auto str_uintwide_t = to_string(val_uintwide_t);
      const auto str_boost      = val_boost.str();

      const auto result_import_bits_is_ok = ((str_uintwide_t == str_boost) && (u_gen == val_uintwide_t));

      result_is_ok = (result_import_bits_is_ok && result_is_ok);
    }
  }

  for(const auto& msv_first : msv_options) // NOLINT
  {
    static const std::array<unsigned, static_cast<std::size_t>(UINT8_C(3))> bits_for_chunks = { 7U, 9U, 15U };

    for(const auto& chunk_size : bits_for_chunks)
    {
      for(auto   i = static_cast<unsigned>(UINT8_C(0));
                 i < static_cast<unsigned>(loop_count_lo);
               ++i)
      {
        // Verify import_bits() and compare with Boost control value(s).
        // The input and output ranges have elements having the same widths.
        // Use various input bit counts less than the result limb's width.
        // Use the full size of elements in the wide integer for the
        // distance of the input range.

        using local_representation_type = typename local_uintwide_t_small_unsigned_type::representation_type;

        auto u_gen = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();

        local_representation_type bits(u_gen.crepresentation());

        if(msv_first)
        {
          std::reverse(bits.begin(), bits.end());
        }

        local_uintwide_t_small_unsigned_type val_uintwide_t { };
        local_boost_small_uint_type          val_boost      { };

        using std::to_string;

        static_cast<void>(import_bits(val_uintwide_t, bits.cbegin(), bits.cend(), chunk_size, msv_first));
        static_cast<void>(import_bits(val_boost,      bits.cbegin(), bits.cend(), chunk_size, msv_first)); // NOLINT

        const auto str_uintwide_t = to_string(val_uintwide_t);
        const auto str_boost      =           val_boost.str();

        const auto result_import_bits_is_ok = (str_uintwide_t == str_boost);

        result_is_ok = (result_import_bits_is_ok && result_is_ok);
      }
    }
  }

  for(const auto& msv_first : msv_options) // NOLINT
  {
    for(auto   i = static_cast<unsigned>(UINT8_C(0));
               i < static_cast<unsigned>(loop_count_lo);
             ++i)
    {
      // Verify import_bits() and compare with Boost control value(s).
      // The input and output ranges have elements having different widths.
      // Use various input bit counts exceeding the result limb's width.
      // Use the full size of elements in the wide integer for the
      // distance of the input range.

      using local_representation_type = typename local_uintwide_t_small_unsigned_type::representation_type;

      using local_input_value_type = typename local_representation_type::value_type;

      auto u_gen = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();

      local_representation_type bits(u_gen.crepresentation());

      #if defined(WIDE_INTEGER_NAMESPACE)
      using local_input_double_width_value_type =
        typename WIDE_INTEGER_NAMESPACE::math::wide_integer::detail::uint_type_helper<static_cast<std::size_t>(std::numeric_limits<local_input_value_type>::digits * 2)>::exact_unsigned_type;
      #else
      using local_input_double_width_value_type =
        typename ::math::wide_integer::detail::uint_type_helper<static_cast<std::size_t>(std::numeric_limits<local_input_value_type>::digits * 2)>::exact_unsigned_type;
      #endif

      using local_double_width_input_array_type =
        std::array<local_input_double_width_value_type, local_uintwide_t_small_unsigned_type::number_of_limbs / 2U>;

      local_double_width_input_array_type bits_double_width;

      {
        using local_size_type = typename local_representation_type::size_type;

        auto index = static_cast<local_size_type>(UINT8_C(0));

        for(auto& elem : bits_double_width)
        {
          #if defined(WIDE_INTEGER_NAMESPACE)
          using WIDE_INTEGER_NAMESPACE::math::wide_integer::detail::make_large;
          #else
          using ::math::wide_integer::detail::make_large;
          #endif

          const auto index_plus_one =
            static_cast<local_size_type>
            (
              index + static_cast<local_size_type>(UINT8_C(1))
            );

          #if defined(WIDE_INTEGER_NAMESPACE)
          elem = make_large(*WIDE_INTEGER_NAMESPACE::math::wide_integer::detail::advance_and_point(bits.cbegin(), index),
                            *WIDE_INTEGER_NAMESPACE::math::wide_integer::detail::advance_and_point(bits.cbegin(), index_plus_one));
          #else
          elem = make_large(*::math::wide_integer::detail::advance_and_point(bits.cbegin(), index),
                            *::math::wide_integer::detail::advance_and_point(bits.cbegin(), index_plus_one));
          #endif

          index = static_cast<local_size_type>(index + static_cast<local_size_type>(UINT8_C(2)));
        }
      }

      local_uintwide_t_small_unsigned_type val_uintwide_t { };
      local_boost_small_uint_type          val_boost      { };

      using std::to_string;

      static_cast<void>(import_bits(val_uintwide_t, bits_double_width.cbegin(), bits_double_width.cend(), static_cast<unsigned>(std::numeric_limits<local_input_double_width_value_type>::digits), msv_first));
      static_cast<void>(import_bits(val_boost,      bits_double_width.cbegin(), bits_double_width.cend(), static_cast<unsigned>(std::numeric_limits<local_input_double_width_value_type>::digits), msv_first)); // NOLINT

      const auto str_uintwide_t = to_string(val_uintwide_t);
      const auto str_boost      =           val_boost.str();

      const auto result_import_bits_is_ok = (str_uintwide_t == str_boost);

      result_is_ok = (result_import_bits_is_ok && result_is_ok);
    }
  }

  for(const auto& msv_first : msv_options) // NOLINT
  {
    for(auto   i = static_cast<unsigned>(UINT8_C(0));
               i < static_cast<unsigned>(loop_count_lo);
             ++i)
    {
      // Verify import_bits() and compare with Boost control value(s).
      // Use various input bit counts exceeding the result limb's width.
      // Use only part of the size of elements in the wide integer for the
      // distance of the input range.

      using local_representation_type = typename local_uintwide_t_small_unsigned_type::representation_type;

      using local_input_value_type = typename local_representation_type::value_type;

      auto u_gen = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();

      using local_representation_less_wide_type =
        std::array<local_input_value_type, static_cast<std::size_t>(static_cast<std::size_t>(local_uintwide_t_small_unsigned_type::number_of_limbs) - 2U)>;

      local_representation_less_wide_type bits { };

      std::copy(u_gen.crepresentation().cbegin(),
                #if defined(WIDE_INTEGER_NAMESPACE)
                WIDE_INTEGER_NAMESPACE::math::wide_integer::detail::advance_and_point(u_gen.crepresentation().cbegin(), std::tuple_size<local_representation_less_wide_type>::value),
                #else
                ::math::wide_integer::detail::advance_and_point(u_gen.crepresentation().cbegin(), std::tuple_size<local_representation_less_wide_type>::value),
                #endif
                bits.begin());

      #if defined(WIDE_INTEGER_NAMESPACE)
      using local_input_double_width_value_type =
        typename WIDE_INTEGER_NAMESPACE::math::wide_integer::detail::uint_type_helper<static_cast<std::size_t>(std::numeric_limits<local_input_value_type>::digits * 2)>::exact_unsigned_type;
      #else
      using local_input_double_width_value_type =
        typename ::math::wide_integer::detail::uint_type_helper<static_cast<std::size_t>(std::numeric_limits<local_input_value_type>::digits * 2)>::exact_unsigned_type;
      #endif

      using local_double_width_less_wide_input_array_type =
        std::array<local_input_double_width_value_type, std::tuple_size<local_representation_less_wide_type>::value / 2U>;

      static_assert(std::tuple_size<local_double_width_less_wide_input_array_type>::value == static_cast<std::size_t>(static_cast<std::size_t>(static_cast<std::size_t>(local_uintwide_t_small_unsigned_type::number_of_limbs) / 2U) - 1U),
                    "Error: Type definition widths are not OK");

      local_double_width_less_wide_input_array_type bits_double_width;

      {
        using local_size_type = typename local_representation_type::size_type;

        auto index = static_cast<local_size_type>(UINT8_C(0));

        for(auto& elem : bits_double_width)
        {
          #if defined(WIDE_INTEGER_NAMESPACE)
          using WIDE_INTEGER_NAMESPACE::math::wide_integer::detail::make_large;
          #else
          using ::math::wide_integer::detail::make_large;
          #endif

          const auto index_plus_one =
            static_cast<local_size_type>
            (
              index + static_cast<local_size_type>(UINT8_C(1))
            );

          elem = make_large(bits[index], bits[index_plus_one]); // NOLINT(cppcoreguidelines-pro-bounds-constant-array-index)

          index = static_cast<local_size_type>(index + static_cast<local_size_type>(UINT8_C(2)));
        }
      }

      local_uintwide_t_small_unsigned_type val_uintwide_t { };
      local_boost_small_uint_type          val_boost      { };

      using std::to_string;

      static_cast<void>(import_bits(val_uintwide_t, bits_double_width.cbegin(), bits_double_width.cend(), static_cast<unsigned>(std::numeric_limits<local_input_double_width_value_type>::digits), msv_first));
      static_cast<void>(import_bits(val_boost,      bits_double_width.cbegin(), bits_double_width.cend(), static_cast<unsigned>(std::numeric_limits<local_input_double_width_value_type>::digits), msv_first)); // NOLINT

      const auto str_uintwide_t = to_string(val_uintwide_t);
      const auto str_boost      =           val_boost.str();

      const auto result_import_bits_is_ok = (str_uintwide_t == str_boost);

      result_is_ok = (result_import_bits_is_ok && result_is_ok);
    }
  }

  {
    // Additional verification of import_bits().

    const std::array<std::uint32_t, 1U> bits_in = { static_cast<std::uint32_t>(UINT32_C(0x5555AAAA)) };

    using chunk_sizes_array_type = std::array<unsigned, static_cast<std::size_t>(UINT8_C(4))>;

    static const chunk_sizes_array_type various_chunk_sizes =
    {
      0U, 32U, 24U, 2U
    };

    static const std::array<std::uint32_t, std::tuple_size<chunk_sizes_array_type>::value> various_import_results =
    {
      static_cast<std::uint32_t>(UINT32_C(0x5555AAAA)),
      static_cast<std::uint32_t>(UINT32_C(0x5555AAAA)),
      static_cast<std::uint32_t>(UINT32_C(0x0055AAAA)),
      static_cast<std::uint32_t>(UINT32_C(2))
    };

    for(auto i = static_cast<std::size_t>(UINT8_C(0)); i < various_chunk_sizes.size(); ++i)
    {
      auto u = local_uintwide_t_small_unsigned_type { };

      static_cast<void>
      (
        import_bits(u, bits_in.cbegin(), bits_in.cend(), various_chunk_sizes[i]) // NOLINT(cppcoreguidelines-pro-bounds-constant-array-index)
      );

      const auto result_import_is_ok = (u == various_import_results[i]); // NOLINT(cppcoreguidelines-pro-bounds-constant-array-index)

      result_is_ok = (result_import_is_ok && result_is_ok);
    }
  }

  return result_is_ok;
}